

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsGraph.h
# Opt level: O0

void __thiscall
dg::vr::RelationsGraph<dg::vr::ValueRelations>::makeBorderBucket
          (RelationsGraph<dg::vr::ValueRelations> *this,Bucket *b,size_t id)

{
  Bucket *__args_1;
  Bucket *in_RDX;
  Bucket *in_RSI;
  RelationsGraph<dg::vr::ValueRelations> *in_RDI;
  size_t currentId;
  
  __args_1 = (Bucket *)getBorderId(in_RDI,in_RSI);
  if (__args_1 != in_RDX) {
    std::
    vector<std::pair<unsigned_long,std::reference_wrapper<dg::vr::Bucket_const>>,std::allocator<std::pair<unsigned_long,std::reference_wrapper<dg::vr::Bucket_const>>>>
    ::emplace_back<unsigned_long&,dg::vr::Bucket_const&>
              ((vector<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
                *)in_RSI,&in_RDX->id,__args_1);
  }
  return;
}

Assistant:

void makeBorderBucket(const Bucket &b, size_t id) {
        size_t currentId = getBorderId(b);
        if (currentId == id)
            return;

        assert(getBorderB(id) == nullptr);
        assert(getBorderId(b) == std::string::npos);
        borderBuckets.emplace_back(id, b);
    }